

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O3

void clask::serve_dir(response_writer *resp,request *req,string *path)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  path *ppVar6;
  long lVar7;
  ostream *poVar8;
  size_type sVar9;
  path *__p;
  byte *pbVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  _Alloc_hider _Var12;
  string buf;
  directory_iterator __begin1;
  string buf_1;
  string fn;
  wstring wpath;
  ostringstream os;
  path local_278;
  response_writer *local_250;
  directory_iterator local_248;
  char *local_238;
  long local_230;
  char local_228;
  undefined7 uStack_227;
  string local_218;
  directory_iterator local_1f8;
  string local_1e8;
  wstring local_1c8;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  to_wstring(&local_1c8,path);
  resp->code = 200;
  local_250 = resp;
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"content-type","");
  local_1a8._0_8_ = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"text/html; charset=utf-8","")
  ;
  response_writer::set_header(local_250,&local_1e8,(string *)local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._0_8_ != local_198) {
    operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>",0x3c);
  local_278._M_pathname._M_dataplus._M_p = (pointer)&local_278._M_pathname.field_2;
  local_278._M_pathname._M_string_length = 0;
  local_278._M_pathname.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&local_278);
  sVar9 = (req->uri)._M_string_length;
  if (sVar9 != 0) {
    pbVar10 = (byte *)(req->uri)._M_dataplus._M_p;
    do {
      bVar1 = *pbVar10;
      if (bVar1 < 0x27) {
        if ((bVar1 == 0x22) || (bVar1 == 0x26)) goto LAB_0010a827;
LAB_0010a839:
        std::__cxx11::string::append((char *)&local_278,(ulong)pbVar10);
      }
      else {
        if ((bVar1 != 0x27) && ((bVar1 != 0x3c && (bVar1 != 0x3e)))) goto LAB_0010a839;
LAB_0010a827:
        std::__cxx11::string::append((char *)&local_278);
      }
      pbVar10 = pbVar10 + 1;
      sVar9 = sVar9 - 1;
    } while (sVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_278._M_pathname._M_dataplus._M_p,
             local_278._M_pathname._M_string_length);
  paVar11 = &local_278._M_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_pathname._M_dataplus._M_p != paVar11) {
    operator_delete(local_278._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_278._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"</title>\n</head>\n<body>\n",0x18);
  std::__cxx11::stringbuf::str();
  (**local_250->_vptr_response_writer)(local_250,&local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_pathname._M_dataplus._M_p != paVar11) {
    operator_delete(local_278._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_278._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  local_278._M_pathname._M_dataplus._M_p = (pointer)paVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_pathname._M_dataplus._M_p != paVar11) {
    operator_delete(local_278._M_pathname._M_dataplus._M_p,
                    CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                             local_278._M_pathname.field_2._M_local_buf[0]) + 1);
  }
  iVar3 = (int)(ostream *)local_1a8;
  std::ios::clear((int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + iVar3);
  std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
            (&local_278,&local_1c8,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_1f8,&local_278,none,(error_code *)0x0);
  std::filesystem::__cxx11::path::~path(&local_278);
  if (local_1f8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_248._M_dir._M_ptr = local_1f8._M_dir._M_ptr;
    local_248._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_248._M_dir._M_ptr = local_1f8._M_dir._M_ptr;
      local_248._M_dir._M_refcount._M_pi = local_1f8._M_dir._M_refcount._M_pi;
      if (local_1f8._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      goto LAB_0010a9bc;
    }
    else {
      *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) + 1;
    }
    local_248._M_dir._M_ptr = local_1f8._M_dir._M_ptr;
    local_248._M_dir._M_refcount._M_pi = local_1f8._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_1f8._M_dir._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1f8._M_dir._M_refcount._M_pi);
  }
LAB_0010a9bc:
  do {
    paVar11 = &local_278._M_pathname.field_2;
    if (local_248._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (local_1f8._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8._M_dir._M_refcount._M_pi);
      }
      local_278._M_pathname._M_dataplus._M_p = (pointer)paVar11;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"</body>\n</html>\n","");
      (**local_250->_vptr_response_writer)(local_250,&local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_pathname._M_dataplus._M_p != paVar11) {
        operator_delete(local_278._M_pathname._M_dataplus._M_p,
                        CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                                 local_278._M_pathname.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity * 4 + 4);
      }
      return;
    }
    ppVar6 = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_248);
    sVar9 = (ppVar6->_M_pathname)._M_string_length;
    if (sVar9 == 0) {
LAB_0010aa43:
      std::filesystem::__cxx11::path::path(&local_278);
    }
    else {
      uVar2 = *(ulong *)&ppVar6->_M_cmpts;
      uVar5 = (uint)uVar2;
      __p = ppVar6;
      if ((~(byte)uVar2 & 3) != 0) {
        if (((uVar2 & 3) == 0) && ((ppVar6->_M_pathname)._M_dataplus._M_p[sVar9 - 1] != '/')) {
          if ((uVar2 & 3) == 0) {
            lVar7 = std::filesystem::__cxx11::path::_List::end();
            __p = (path *)(lVar7 + -0x30);
            if ((*(ulong *)&ppVar6->_M_cmpts & 3) != 0) {
              __p = ppVar6;
            }
            uVar5 = (uint)*(undefined8 *)&__p->_M_cmpts;
          }
          if ((~uVar5 & 3) == 0) goto LAB_0010aa39;
        }
        goto LAB_0010aa43;
      }
LAB_0010aa39:
      std::filesystem::__cxx11::path::path(&local_278,__p);
    }
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,local_278._M_pathname._M_dataplus._M_p,
               local_278._M_pathname._M_dataplus._M_p + local_278._M_pathname._M_string_length);
    std::filesystem::__cxx11::path::~path(&local_278);
    cVar4 = *(char *)&ppVar6[1]._M_pathname._M_dataplus._M_p;
    if ((cVar4 == '\x03') || (cVar4 == '\0')) {
      cVar4 = std::filesystem::status(ppVar6);
    }
    if (cVar4 == '\x02') {
      std::__cxx11::string::append((char *)&local_218);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"<a href=\"",9);
    url_encode(&local_278._M_pathname,&local_218,false);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_278._M_pathname._M_dataplus._M_p,
                        local_278._M_pathname._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\">",2);
    local_238 = &local_228;
    local_230 = 0;
    local_228 = '\0';
    std::__cxx11::string::reserve((ulong)&local_238);
    _Var12._M_p = local_218._M_dataplus._M_p;
    for (sVar9 = local_218._M_string_length; sVar9 != 0; sVar9 = sVar9 - 1) {
      bVar1 = *_Var12._M_p;
      if (bVar1 < 0x27) {
        if ((bVar1 == 0x22) || (bVar1 == 0x26)) goto LAB_0010ab6f;
LAB_0010ab81:
        std::__cxx11::string::append((char *)&local_238,(ulong)_Var12._M_p);
      }
      else {
        if ((bVar1 != 0x27) && ((bVar1 != 0x3c && (bVar1 != 0x3e)))) goto LAB_0010ab81;
LAB_0010ab6f:
        std::__cxx11::string::append((char *)&local_238);
      }
      _Var12._M_p = _Var12._M_p + 1;
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,local_238,local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"</a></br>\n",10);
    paVar11 = &local_278._M_pathname.field_2;
    if (local_238 != &local_228) {
      operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_pathname._M_dataplus._M_p != paVar11) {
      operator_delete(local_278._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_278._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringbuf::str();
    (**local_250->_vptr_response_writer)(local_250,&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_pathname._M_dataplus._M_p != paVar11) {
      operator_delete(local_278._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_278._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    local_278._M_pathname._M_dataplus._M_p = (pointer)paVar11;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"");
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_pathname._M_dataplus._M_p != paVar11) {
      operator_delete(local_278._M_pathname._M_dataplus._M_p,
                      CONCAT71(local_278._M_pathname.field_2._M_allocated_capacity._1_7_,
                               local_278._M_pathname.field_2._M_local_buf[0]) + 1);
    }
    std::ios::clear((int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    std::filesystem::__cxx11::directory_iterator::operator++(&local_248);
  } while( true );
}

Assistant:

inline void serve_dir(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);

  resp.code = 200;
  resp.set_header("content-type", "text/html; charset=utf-8");
  std::ostringstream os;
  os << "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>";
  os << html_encode(req.uri);
  os << "</title>\n</head>\n<body>\n";
  resp.write(os.str());
  os.str("");
  os.clear(std::stringstream::goodbit);

  for (const auto& e : std::filesystem::directory_iterator(wpath)) {
    auto fn = e.path().filename().string();
    if (e.is_directory()) fn += "/";
    os << "<a href=\"" << url_encode(fn, false) << "\">" << html_encode(fn) << "</a></br>\n";
    resp.write(os.str());
    os.str("");
    os.clear(std::stringstream::goodbit);
  }
  resp.write("</body>\n</html>\n");
}